

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O3

int nn_trie_subscribe(nn_trie *self,uint8_t *data,size_t size)

{
  uint16_t *puVar1;
  uint8_t *__src;
  byte bVar2;
  byte bVar3;
  uint32_t uVar4;
  nn_trie_node *pnVar5;
  nn_trie nVar6;
  nn_trie nVar7;
  undefined4 *puVar8;
  byte bVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  size_t __n;
  byte *pbVar13;
  long lVar14;
  byte bVar15;
  long lVar16;
  int iVar17;
  
  nVar6 = (nn_trie)self->root;
  if (nVar6.root != (nn_trie_node *)0x0) {
LAB_00125421:
    __src = (nVar6.root)->prefix;
    bVar9 = (nVar6.root)->prefix_len;
    uVar10 = 0;
    if (bVar9 != 0) {
      uVar12 = (ulong)(uint)bVar9;
      uVar10 = 0;
      do {
        if (size == uVar10) {
          uVar10 = size & 0xffffffff;
          goto LAB_0012545e;
        }
        if (__src[uVar10] != data[uVar10]) goto LAB_0012545e;
        uVar10 = uVar10 + 1;
      } while (uVar12 != uVar10);
      pbVar13 = data + uVar12;
      lVar14 = size - uVar12;
LAB_00125477:
      if (size == uVar12) goto LAB_0012552f;
      pnVar5 = (nn_trie_node *)nn_node_next(nVar6.root,*pbVar13);
      if ((pnVar5 == (nn_trie_node *)0x0) ||
         (nVar6.root = *(nn_trie_node **)pnVar5, nVar6.root == (nn_trie_node *)0x0))
      goto LAB_0012552a;
      data = pbVar13 + 1;
      size = lVar14 - 1;
      self = (nn_trie *)pnVar5;
      goto LAB_00125421;
    }
LAB_0012545e:
    uVar12 = (ulong)(int)uVar10;
    pbVar13 = data + uVar12;
    lVar14 = size - uVar12;
    if ((int)(uint)bVar9 <= (int)uVar10) goto LAB_00125477;
    nVar7.root = (nn_trie_node *)nn_alloc_(0x20);
    *self = (nn_trie)nVar7.root;
    if (nVar7.root == (nn_trie_node *)0x0) {
      __assert_fail("*node",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pubsub/trie.c"
                    ,0x124,"int nn_trie_subscribe(struct nn_trie *, const uint8_t *, size_t)");
    }
    (nVar7.root)->refcount = 0;
    (nVar7.root)->prefix_len = (byte)uVar10;
    (nVar7.root)->type = '\x01';
    memcpy((nVar7.root)->prefix,__src,uVar12);
    (self->root->u).sparse.children[0] = (nVar6.root)->prefix[uVar12];
    bVar9 = ~(byte)uVar10 + (nVar6.root)->prefix_len;
    (nVar6.root)->prefix_len = bVar9;
    memmove(__src,__src + uVar12 + 1,(ulong)bVar9);
    pnVar5 = nn_node_compact(nVar6.root);
    *(nn_trie_node **)(self->root + 1) = pnVar5;
LAB_0012552a:
    if (size == uVar12) goto LAB_0012552f;
    nVar6.root = self->root;
    uVar10 = (ulong)(nVar6.root)->type;
    if (uVar10 < 8) {
      nVar6.root = (nn_trie_node *)nn_realloc(nVar6.root,uVar10 * 8 + 0x20);
      *self = (nn_trie)nVar6.root;
      if (nVar6.root == (nn_trie_node *)0x0) {
        __assert_fail("*node",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pubsub/trie.c"
                      ,0x13c,"int nn_trie_subscribe(struct nn_trie *, const uint8_t *, size_t)");
      }
      (nVar6.root)->prefix[(ulong)(nVar6.root)->type + 10] = *pbVar13;
      nVar6.root = self->root;
      bVar9 = (nVar6.root)->type + 1;
      (nVar6.root)->type = bVar9;
      self = (nn_trie *)((nVar6.root)->prefix + (ulong)bVar9 * 8 + 10);
      ((nn_trie_node *)self)->refcount = 0;
      ((nn_trie_node *)self)->type = '\0';
      ((nn_trie_node *)self)->prefix_len = '\0';
      ((nn_trie_node *)self)->prefix[0] = '\0';
      ((nn_trie_node *)self)->prefix[1] = '\0';
    }
    else {
      if ((nVar6.root)->type == 9) {
        bVar9 = *pbVar13;
        bVar15 = ((nVar6.root)->u).sparse.children[0];
        bVar2 = ((nVar6.root)->u).sparse.children[1];
        if ((bVar9 < bVar15) || (bVar2 < bVar9)) {
          if (bVar9 <= bVar15) {
            bVar15 = bVar9;
          }
          if (bVar2 <= bVar9) {
            bVar2 = bVar9;
          }
          iVar17 = (uint)bVar2 - (uint)bVar15;
          nVar6.root = (nn_trie_node *)nn_realloc(nVar6.root,(long)iVar17 * 8 + 0x20);
          *self = (nn_trie)nVar6.root;
          if (nVar6.root == (nn_trie_node *)0x0) {
            __assert_fail("*node",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pubsub/trie.c"
                          ,0x14f,"int nn_trie_subscribe(struct nn_trie *, const uint8_t *, size_t)")
            ;
          }
          bVar3 = ((nVar6.root)->u).sparse.children[0];
          lVar11 = (ulong)((nVar6.root)->u).sparse.children[1] - (ulong)bVar3;
          lVar16 = lVar11 + 1;
          if (bVar3 == bVar15) {
            nVar6.root = (nn_trie_node *)((nVar6.root)->prefix + (long)(int)lVar16 * 8 + -6);
            lVar11 = (long)(iVar17 - (int)lVar11);
          }
          else {
            lVar11 = (long)(int)((uint)bVar3 - (uint)bVar15);
            memmove(nVar6.root[1].prefix + lVar11 * 8 + -6,nVar6.root + 1,lVar16 * 8);
            nVar6.root = self->root;
          }
          memset(nVar6.root + 1,0,lVar11 << 3);
          (self->root->u).sparse.children[0] = bVar15;
          (self->root->u).sparse.children[1] = bVar2;
          nVar6.root = self->root;
        }
        puVar1 = &((nVar6.root)->u).dense.nbr;
        *puVar1 = *puVar1 + 1;
        self = (nn_trie *)
               ((long)self->root +
               ((ulong)bVar9 - (ulong)(self->root->u).sparse.children[0]) * 8 + 0x18);
      }
      else {
        bVar9 = 0xff;
        uVar12 = 0;
        bVar15 = 0;
        do {
          bVar2 = (nVar6.root)->prefix[uVar12 + 10];
          if (bVar2 <= bVar9) {
            bVar9 = bVar2;
          }
          if (bVar2 < bVar15) {
            bVar2 = bVar15;
          }
          bVar15 = bVar2;
          uVar12 = uVar12 + 1;
        } while (uVar10 != uVar12);
        bVar2 = *pbVar13;
        if (bVar2 <= bVar9) {
          bVar9 = bVar2;
        }
        if (bVar2 < bVar15) {
          bVar2 = bVar15;
        }
        lVar16 = (long)(int)((uint)bVar2 - (uint)bVar9);
        nVar7.root = (nn_trie_node *)nn_alloc_(lVar16 * 8 + 0x20);
        *self = (nn_trie)nVar7.root;
        if (nVar7.root == (nn_trie_node *)0x0) {
          __assert_fail("*node",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pubsub/trie.c"
                        ,0x17d,"int nn_trie_subscribe(struct nn_trie *, const uint8_t *, size_t)");
        }
        (nVar7.root)->refcount = 0;
        bVar15 = (nVar6.root)->prefix_len;
        (nVar7.root)->prefix_len = bVar15;
        (nVar7.root)->type = '\t';
        memcpy((nVar7.root)->prefix,(nVar6.root)->prefix,(ulong)bVar15);
        (self->root->u).sparse.children[0] = bVar9;
        (self->root->u).sparse.children[1] = bVar2;
        (self->root->u).dense.nbr = (nVar6.root)->type + 1;
        memset(self->root + 1,0,lVar16 * 8 + 8);
        bVar15 = (nVar6.root)->type;
        if ((ulong)bVar15 != 0) {
          uVar10 = 0;
          do {
            *(undefined8 *)
             ((long)self->root +
             ((ulong)(nVar6.root)->prefix[uVar10 + 10] - (ulong)(uint)bVar9) * 8 + 0x18) =
                 *(undefined8 *)(nVar6.root[1].prefix + uVar10 * 8 + -6);
            uVar10 = uVar10 + 1;
          } while (bVar15 != uVar10);
        }
        self = (nn_trie *)nn_node_next(self->root,*pbVar13);
        nn_free(nVar6.root);
      }
      lVar16._0_4_ = ((nn_trie_node *)self)->refcount;
      lVar16._4_1_ = ((nn_trie_node *)self)->type;
      lVar16._5_1_ = ((nn_trie_node *)self)->prefix_len;
      lVar16._6_1_ = ((nn_trie_node *)self)->prefix[0];
      lVar16._7_1_ = ((nn_trie_node *)self)->prefix[1];
      if (lVar16 != 0) {
        __assert_fail("!*node",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pubsub/trie.c"
                      ,0x197,"int nn_trie_subscribe(struct nn_trie *, const uint8_t *, size_t)");
      }
    }
    data = pbVar13 + 1;
    size = lVar14 - 1;
  }
  uVar10 = (ulong)(10 < size);
  puVar8 = (undefined4 *)nn_alloc_(uVar10 * 8 + 0x18);
  *self = (nn_trie)puVar8;
  while( true ) {
    if (puVar8 == (undefined4 *)0x0) {
      __assert_fail("*node",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pubsub/trie.c"
                    ,0x19e,"int nn_trie_subscribe(struct nn_trie *, const uint8_t *, size_t)");
    }
    *puVar8 = 0;
    *(char *)(puVar8 + 1) = (char)uVar10;
    __n = 10;
    if (size < 10) {
      __n = size;
    }
    *(char *)((long)puVar8 + 5) = (char)__n;
    memcpy((void *)((long)puVar8 + 6),data,__n);
    if ((char)uVar10 == '\0') break;
    uVar10 = (ulong)self->root->prefix_len;
    pbVar13 = data + uVar10;
    data = pbVar13 + 1;
    (self->root->u).sparse.children[0] = *pbVar13;
    pnVar5 = self->root;
    self = (nn_trie *)(pnVar5 + 1);
    size = size + ~uVar10;
    uVar10 = (ulong)(10 < size);
    puVar8 = (undefined4 *)nn_alloc_(uVar10 * 8 + 0x18);
    *(undefined4 **)(pnVar5 + 1) = puVar8;
  }
LAB_0012552f:
  uVar4 = self->root->refcount;
  self->root->refcount = uVar4 + 1;
  return (int)(uVar4 == 0);
}

Assistant:

int nn_trie_subscribe (struct nn_trie *self, const uint8_t *data, size_t size)
{
    int i;
    struct nn_trie_node **node;
    struct nn_trie_node **n;
    struct nn_trie_node *ch;
    struct nn_trie_node *old_node;
    int pos;
    uint8_t c;
    uint8_t c2;
    uint8_t new_min;
    uint8_t new_max;
    int old_children;
    int new_children;
    int inserted;
    int more_nodes;

    /*  Step 1 -- Traverse the trie. */

    node = &self->root;
    pos = 0;
    while (1) {

        /*  If there are no more nodes on the path, go to step 4. */
        if (!*node)
            goto step4;

        /*  Check whether prefix matches the new subscription. */
        pos = nn_node_check_prefix (*node, data, size);
        data += pos;
        size -= pos;

        /*  If only part of the prefix matches, go to step 2. */
        if (pos < (*node)->prefix_len)
            goto step2;

        /*  Even if whole prefix matches and there's no more data to match,
            go directly to step 5. */
        if (!size)
            goto step5;

        /*  Move to the next node. If it is not present, go to step 3. */
        n = nn_node_next (*node, *data);
        if (!n || !*n)
            goto step3;
        node = n;
        ++data;
        --size;
    }

    /*  Step 2 -- Split the prefix into two parts if required. */
step2:

    ch = *node;
    *node = nn_alloc (sizeof (struct nn_trie_node) +
        sizeof (struct nn_trie_node*), "trie node");
    assert (*node);
    (*node)->refcount = 0;
    (*node)->prefix_len = pos;
    (*node)->type = 1;
    memcpy ((*node)->prefix, ch->prefix, pos);
    (*node)->u.sparse.children [0] = ch->prefix [pos];
    ch->prefix_len -= (pos + 1);
    memmove (ch->prefix, ch->prefix + pos + 1, ch->prefix_len);
    ch = nn_node_compact (ch);
    *nn_node_child (*node, 0) = ch;
    pos = (*node)->prefix_len;

    /*  Step 3 -- Adjust the child array to accommodate the new character. */
step3:

    /*  If there are no more data in the subscription, there's nothing to
        adjust in the child array. Proceed directly to the step 5. */
    if (!size)
        goto step5;

    /*  If the new branch fits into sparse array... */
    if ((*node)->type < NN_TRIE_SPARSE_MAX) {
        *node = nn_realloc (*node, sizeof (struct nn_trie_node) +
            ((*node)->type + 1) * sizeof (struct nn_trie_node*));
        assert (*node);
        (*node)->u.sparse.children [(*node)->type] = *data;
        ++(*node)->type;
        node = nn_node_child (*node, (*node)->type - 1);
        *node = NULL;
        ++data;
        --size;
        goto step4;
    }

    /*  If the node is already a dense array, resize it to fit the next
        character. */
    if ((*node)->type == NN_TRIE_DENSE_TYPE) {
        c = *data;
        if (c < (*node)->u.dense.min || c > (*node)->u.dense.max) {
            new_min = (*node)->u.dense.min < c ? (*node)->u.dense.min : c;
            new_max = (*node)->u.dense.max > c ? (*node)->u.dense.max : c;
            *node = nn_realloc (*node, sizeof (struct nn_trie_node) +
                (new_max - new_min + 1) * sizeof (struct nn_trie_node*));
            assert (*node);
            old_children = (*node)->u.dense.max - (*node)->u.dense.min + 1;
            new_children = new_max - new_min + 1;
            if ((*node)->u.dense.min != new_min) {
                inserted = (*node)->u.dense.min - new_min;
                memmove (nn_node_child (*node, inserted),
                    nn_node_child (*node, 0),
                    old_children * sizeof (struct nn_trie_node*));
                memset (nn_node_child (*node, 0), 0,
                    inserted * sizeof (struct nn_trie_node*));
            }
            else {
                memset (nn_node_child (*node, old_children), 0,
                    (new_children - old_children) *
                    sizeof (struct nn_trie_node*));
            }
            (*node)->u.dense.min = new_min;
            (*node)->u.dense.max = new_max;
        }
        ++(*node)->u.dense.nbr;

        node = nn_node_child (*node, c - (*node)->u.dense.min);
        ++data;
        --size;
        goto step4;
    }

    /*  This is a sparse array, but no more children can be added to it.
        We have to convert it into a dense array. */
    {
        /*  First, determine the range of children. */
        new_min = 255;
        new_max = 0;
        for (i = 0; i != (*node)->type; ++i) {
            c2 = (*node)->u.sparse.children [i];
            new_min = new_min < c2 ? new_min : c2;
            new_max = new_max > c2 ? new_max : c2;
        }
        new_min = new_min < *data ? new_min : *data;
        new_max = new_max > *data ? new_max : *data;

        /*  Create a new mode, while keeping the old one for a while. */
        old_node = *node;
        *node = (struct nn_trie_node*) nn_alloc (sizeof (struct nn_trie_node) +
            (new_max - new_min + 1) * sizeof (struct nn_trie_node*),
            "trie node");
        assert (*node);

        /*  Fill in the new node. */
        (*node)->refcount = 0;
        (*node)->prefix_len = old_node->prefix_len;
        (*node)->type = NN_TRIE_DENSE_TYPE;
        memcpy ((*node)->prefix, old_node->prefix, old_node->prefix_len);
        (*node)->u.dense.min = new_min;
        (*node)->u.dense.max = new_max;
        (*node)->u.dense.nbr = old_node->type + 1;
        memset (*node + 1, 0, (new_max - new_min + 1) *
            sizeof (struct nn_trie_node*));
        for (i = 0; i != old_node->type; ++i)
            *nn_node_child (*node, old_node->u.sparse.children [i] - new_min) =
                *nn_node_child (old_node, i);
        node = nn_node_next (*node, *data);
        ++data;
        --size;

        /*  Get rid of the obsolete old node. */
        nn_free (old_node);
    }

    /*  Step 4 -- Create new nodes for remaining part of the subscription. */
step4:

    assert (!*node);
    while (1) {

        /*  Create a new node to hold the next part of the subscription. */
        more_nodes = size > NN_TRIE_PREFIX_MAX;
        *node = nn_alloc (sizeof (struct nn_trie_node) +
            (more_nodes ? sizeof (struct nn_trie_node*) : 0), "trie node");
        assert (*node);

        /*  Fill in the new node. */
        (*node)->refcount = 0;
        (*node)->type = more_nodes ? 1 : 0;
        (*node)->prefix_len = size < (uint8_t) NN_TRIE_PREFIX_MAX ?
            (uint8_t) size : (uint8_t) NN_TRIE_PREFIX_MAX;
        memcpy ((*node)->prefix, data, (*node)->prefix_len);
        data += (*node)->prefix_len;
        size -= (*node)->prefix_len;
        if (!more_nodes)
            break;
        (*node)->u.sparse.children [0] = *data;
        node = nn_node_child (*node, 0);
        ++data;
        --size;
    }

    /*  Step 5 -- Create the subscription as such. */
step5:

    ++(*node)->refcount;

    /*  Return 1 in case of a fresh subscription. */
    return (*node)->refcount == 1 ? 1 : 0;
}